

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::HasSOName(cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  TargetType TVar3;
  char *pcVar4;
  bool local_7a;
  string local_78;
  byte local_55;
  byte local_42;
  allocator local_41;
  string local_40;
  string *local_20;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  local_20 = config;
  config_local = (string *)this;
  TVar3 = GetType(this);
  local_42 = 0;
  local_55 = 0;
  bVar1 = false;
  local_7a = false;
  if (TVar3 == SHARED_LIBRARY) {
    std::allocator<char>::allocator();
    local_42 = 1;
    std::__cxx11::string::string((string *)&local_40,"NO_SONAME",&local_41);
    local_55 = 1;
    bVar2 = GetPropertyAsBool(this,&local_40);
    local_7a = false;
    if (!bVar2) {
      this_00 = this->Makefile;
      GetLinkerLanguage(&local_78,this,local_20);
      bVar1 = true;
      pcVar4 = cmMakefile::GetSONameFlag(this_00,&local_78);
      local_7a = pcVar4 != (char *)0x0;
    }
  }
  this_local._7_1_ = local_7a;
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((local_55 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  if ((local_42 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGeneratorTarget::HasSOName(const std::string& config) const
{
  // soname is supported only for shared libraries and modules,
  // and then only when the platform supports an soname flag.
  return ((this->GetType() == cmStateEnums::SHARED_LIBRARY) &&
          !this->GetPropertyAsBool("NO_SONAME") &&
          this->Makefile->GetSONameFlag(this->GetLinkerLanguage(config)));
}